

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O2

void touch_file(char *name,uint size)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uStackY_210;
  undefined1 local_1f8 [16];
  uv_fs_t req;
  
  iVar1 = uv_fs_open(0,&req,name,0x241,0x180,0);
  uv_fs_req_cleanup(&req);
  if (iVar1 < 0) {
    pcVar3 = "r >= 0";
    uStackY_210 = 0x50;
  }
  else {
    local_1f8 = uv_buf_init("a",1);
    uVar4 = 0;
    do {
      if (size == uVar4) {
        iVar1 = uv_fs_close(0,&req,iVar1,0);
        uv_fs_req_cleanup(&req);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uStackY_210 = 0x5e;
        goto LAB_0011ae75;
      }
      iVar2 = uv_fs_write(0,&req,iVar1,local_1f8,1,uVar4,0);
      uv_fs_req_cleanup();
      uVar4 = uVar4 + 1;
    } while (-1 < iVar2);
    pcVar3 = "r >= 0";
    uStackY_210 = 0x59;
  }
LAB_0011ae75:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-copyfile.c"
          ,uStackY_210,pcVar3);
  abort();
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT | O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r >= 0);
  file = r;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT(r >= 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r == 0);
}